

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDIS.cpp
# Opt level: O2

int main(void)

{
  PointRecord1 *this;
  allocator<char> local_1b1;
  KFLOAT64 GeoZ;
  KFLOAT64 GeoY;
  KFLOAT64 GeoX;
  EnvironmentRecordPtr local_198;
  KString local_180;
  WorldCoordinates loc;
  Environmental_Process_PDU ourEnvProcPDU;
  Connection conn;
  
  KDIS::PDU::Environmental_Process_PDU::Environmental_Process_PDU(&ourEnvProcPDU);
  KDIS::DATA_TYPE::EntityIdentifier::EntityIdentifier((EntityIdentifier *)&conn,1,0x7b,1);
  KDIS::PDU::Environmental_Process_PDU::SetEnvironmentalProcessID
            (&ourEnvProcPDU,(EntityIdentifier *)&conn);
  KDIS::DATA_TYPE::EntityIdentifier::~EntityIdentifier((EntityIdentifier *)&conn);
  KDIS::DATA_TYPE::EnvironmentType::EnvironmentType
            ((EnvironmentType *)&conn,Air,0,'\x03',SmallSize,'\0','\0');
  KDIS::PDU::Environmental_Process_PDU::SetEnvironmentType(&ourEnvProcPDU,(EnvironmentType *)&conn);
  KDIS::DATA_TYPE::EnvironmentType::~EnvironmentType((EnvironmentType *)&conn);
  GeoX = 0.0;
  GeoY = 0.0;
  GeoZ = 0.0;
  KDIS::UTILS::GeodeticToGeocentric<double>
            (51.083333333333336,3.033333333333333,914.4111192392099,(double *)&GeoX,(double *)&GeoY,
             (double *)&GeoZ,WGS_1984);
  KDIS::DATA_TYPE::WorldCoordinates::WorldCoordinates(&loc,GeoX,GeoY,GeoZ);
  KDIS::PDU::Environmental_Process_PDU::SetEnvironmentStatusOn(&ourEnvProcPDU,true);
  KDIS::PDU::Environmental_Process_PDU::SetSequenceNumber(&ourEnvProcPDU,0xffff);
  this = (PointRecord1 *)operator_new(0x30);
  KDIS::DATA_TYPE::PointRecord1::PointRecord1(this,'\0',&loc);
  local_198._vptr_KRef_Ptr = (_func_int **)&PTR__KRef_Ptr_00214b40;
  local_198.m_pRef = (EnvironmentRecord *)this;
  local_198.m_piCount = (RefCounter *)operator_new(2);
  *local_198.m_piCount = 1;
  KDIS::PDU::Environmental_Process_PDU::AddEnvironmentRecord(&ourEnvProcPDU,&local_198);
  KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>::~KRef_Ptr(&local_198);
  KDIS::PDU::Header6::SetExerciseID((Header6 *)&ourEnvProcPDU,'\x01');
  KDIS::DATA_TYPE::TimeStamp::TimeStamp((TimeStamp *)&conn,RelativeTime,0,true);
  KDIS::PDU::Header6::SetTimeStamp((Header6 *)&ourEnvProcPDU,(TimeStamp *)&conn);
  KDIS::DATA_TYPE::TimeStamp::~TimeStamp((TimeStamp *)&conn);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"192.168.3.255",&local_1b1);
  KDIS::NETWORK::Connection::Connection(&conn,&local_180,3000,false,true,(PDU_Factory *)0x0,false);
  std::__cxx11::string::~string((string *)&local_180);
  do {
    KDIS::NETWORK::Connection::SendPDU(&conn,&ourEnvProcPDU.super_Header);
  } while( true );
}

Assistant:

int main()
{
    // First lets create the PDU object.
    Environmental_Process_PDU ourEnvProcPDU;

    ourEnvProcPDU.SetEnvironmentalProcessID( EntityIdentifier( 1, 123, 1 ) ); // The ID of our application (SiteID, AppID, ObjectID)
    ourEnvProcPDU.SetEnvironmentType( EnvironmentType( Air, 0, 3, SmallSize, 0, 0 ) ); // This value is taken from section 4 of the SISO-REF-010-2006. It represents a small cloud.

    // Convert local coordinate systems to DIS
    // 51.5� N 3.2� W. Cardiff, Wales.
    // A cloud over Wales, what a surprise!
    // Convert Degrees, Minutes, Seconds to decimal and then convert to geocentric.
    KFLOAT64 Lat = KDIS::UTILS::DMSToDecimal( 51.0, 5.0, 0.0 );
    KFLOAT64 Lon = KDIS::UTILS::DMSToDecimal( 3.0, 2.0, 0.0 );
    KFLOAT64 Alt = KDIS::UTILS::FeetToMeters( 3000.0 );
    KFLOAT64 GeoX = 0.0, GeoY = 0.0, GeoZ = 0.0;
    KDIS::UTILS::GeodeticToGeocentric( Lat, Lon, Alt, GeoX, GeoY, GeoZ, WGS_1984 );
    WorldCoordinates loc( GeoX, GeoY, GeoZ );
    ourEnvProcPDU.SetEnvironmentStatusOn( true );
    ourEnvProcPDU.SetSequenceNumber( EP_NO_SEQUENCE );
    ourEnvProcPDU.AddEnvironmentRecord( EnvironmentRecordPtr( new PointRecord1( 0, loc ) ) );

    // Set the PDU Header values
    ourEnvProcPDU.SetExerciseID( 1 );

    // Set the time stamp to automatically calculate.
    ourEnvProcPDU.SetTimeStamp( TimeStamp( RelativeTime, 0, true ) );

    // Note this multi cast address will probably be different for your network.
    Connection conn( "192.168.3.255" );

    KOCTET cBuffer[MAX_PDU_SIZE]; // Somewhere to store the data we send.

    try
    {
        while( true )
        {
            // Keep sending the pdu.
            conn.SendPDU( ( Header * )&ourEnvProcPDU );
        }
    }
    catch( exception & e )
    {
        cout << e.what() << endl;
    }

    return 0;
}